

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensureIntSpinBox(QInputDialogPrivate *this)

{
  QSpinBox *pQVar1;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  offset_in_QSpinBox_to_subr in_stack_00000020;
  QInputDialog *q;
  ConnectionType in_stack_00000040;
  Connection in_stack_fffffffffffffff0;
  ContextType *context;
  
  context = *(ContextType **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->intSpinBox == (QSpinBox *)0x0) {
    pQVar1 = (QSpinBox *)operator_new(0x28);
    QInputDialogSpinBox::QInputDialogSpinBox
              ((QInputDialogSpinBox *)context,(QWidget *)in_stack_fffffffffffffff0.d_ptr);
    in_RDI->intSpinBox = pQVar1;
    QWidget::hide((QWidget *)0x79b42e);
    QObject::connect<void(QSpinBox::*)(int),void(QInputDialog::*)(int)>
              (unaff_retaddr,in_stack_00000020,context,
               (offset_in_QInputDialog_to_subr *)in_stack_fffffffffffffff0.d_ptr,in_stack_00000040);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  }
  if (*(ContextType **)(in_FS_OFFSET + 0x28) == context) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureIntSpinBox()
{
    Q_Q(QInputDialog);
    if (!intSpinBox) {
        intSpinBox = new QInputDialogSpinBox(q);
        intSpinBox->hide();
        QObject::connect(intSpinBox, &QInputDialogSpinBox::valueChanged,
                         q, &QInputDialog::intValueChanged);
    }
}